

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O2

void printInfo(void)

{
  int i_2;
  long lVar1;
  char (*__s) [26];
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int i;
  long lVar6;
  bool bVar7;
  
  printf("Round %d:  %d vs %d\n",(ulong)(uint)turnID,(ulong)(uint)gameBoard.elimTotal[0],
         (ulong)(uint)gameBoard.elimTotal[1]);
  printf("count:");
  for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[0][lVar6]);
  }
  printf("\ncount:");
  for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[1][lVar6]);
  }
  putchar(10);
  putchar(10);
  __s = printInfo::ans;
  lVar6 = 0x14;
  while (lVar6 != 0) {
    sprintf(*__s,"%2d",lVar6);
    __s = __s + 1;
    lVar6 = lVar6 + -1;
  }
  for (lVar6 = 0x18; lVar6 != 0x220; lVar6 = lVar6 + 0x1a) {
    printInfo::ans[0][lVar6] = '|';
    *(undefined1 *)(lVar6 + 0x121ce5) = 0x7c;
    *(undefined1 *)((long)&val.limit_ + lVar6 + 2) = 0x7c;
  }
  lVar1 = 0x1212d8;
  lVar4 = 0x121ee1;
  for (lVar6 = 1; lVar6 != 0x15; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      *(char *)(lVar4 + lVar5) = " *+"[*(int *)(lVar1 + lVar5 * 4)];
    }
    lVar1 = lVar1 + 0x30;
    lVar4 = lVar4 + -0x1a;
  }
  lVar1 = 0x1216f8;
  lVar4 = 0x121eec;
  for (lVar6 = 1; lVar6 != 0x15; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      *(char *)(lVar4 + lVar5) = " *+"[*(int *)(lVar1 + lVar5 * 4)];
    }
    lVar1 = lVar1 + 0x30;
    lVar4 = lVar4 + -0x1a;
  }
  for (lVar6 = 0; lVar6 != 0x208; lVar6 = lVar6 + 0x1a) {
    puts(printInfo::ans[0] + lVar6);
  }
  printf("  ");
  iVar2 = 0x17;
  while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
    putchar(0x2d);
  }
  printf("\n   ");
  iVar2 = -10;
  while (iVar2 != 0) {
    uVar3 = iVar2 + 0xb;
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    printf("%d",(ulong)uVar3);
  }
  putchar(0x7c);
  iVar2 = -10;
  while (iVar2 != 0) {
    uVar3 = iVar2 + 0xb;
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    printf("%d",(ulong)uVar3);
  }
  putchar(10);
  getchar();
  return;
}

Assistant:

void printInfo()
{
    printf("Round %d:  %d vs %d\n", turnID, gameBoard.elimTotal[0], gameBoard.elimTotal[1]);
    printf("count:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[0][i]);
    printf("\ncount:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[1][i]);
    putchar('\n');
    putchar('\n');
    static char ans[20][26] = {};
    for (int i = 1; i <= 20; ++i)
        sprintf(ans[i - 1], "%2d", 21 - i);
    for (int i = 0; i < 20; ++i)
        ans[i][2] = ans[i][13] = ans[i][24] = '|';
    static const char mp[3] = {' ', '*', '+'};
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][2 + j] = mp[gameBoard.gridInfo[0][i][j]];
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][13 + j] = mp[gameBoard.gridInfo[1][i][j]];
    for (int i = 0; i < 20; ++i)
        puts(ans[i]);
    printf("  ");
    for (int i = 0; i < 23; ++i)
        putchar('-');
    printf("\n   ");
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('|');
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('\n');
    getchar();
}